

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  GLFWwindow *handle;
  ostream *this;
  GLFWwindow *window;
  
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    window._4_4_ = -1;
  }
  else {
    handle = glfwCreateWindow(0x280,0x1e0,"Hello World",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle == (GLFWwindow *)0x0) {
      glfwTerminate();
      window._4_4_ = -1;
    }
    else {
      glfwMakeContextCurrent(handle);
      iVar1 = gladLoadGLLoader(glfwGetProcAddress);
      if (iVar1 == 0) {
        this = std::operator<<((ostream *)&std::cout,"Failed to initialize OpenGL context");
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
        window._4_4_ = -1;
      }
      else {
        while (iVar1 = glfwWindowShouldClose(handle), iVar1 == 0) {
          (*glad_glClear)(0x4000);
          glfwSwapBuffers(handle);
          glfwPollEvents();
        }
        glfwTerminate();
        window._4_4_ = 0;
      }
    }
  }
  return window._4_4_;
}

Assistant:

int main(void)
{
    GLFWwindow* window;

    /* Initialize the library */
    if (!glfwInit())
        return -1;

    /* Create a windowed mode window and its OpenGL context */
    window = glfwCreateWindow(640, 480, "Hello World", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        return -1;
    }

    /* Make the window's context current */
    glfwMakeContextCurrent(window);
    if (!gladLoadGLLoader((GLADloadproc) glfwGetProcAddress)) {
        std::cout << "Failed to initialize OpenGL context" << std::endl;
        return -1;
    }

    /* Loop until the user closes the window */
    while (!glfwWindowShouldClose(window))
    {
        /* Render here */
        glClear(GL_COLOR_BUFFER_BIT);

        /* Swap front and back buffers */
        glfwSwapBuffers(window);

        /* Poll for and process events */
        glfwPollEvents();
    }

    glfwTerminate();
    return 0;
}